

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

bool erlang_check(double param_1,double b,int c)

{
  long lVar1;
  char *pcVar2;
  
  if (b <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERLANG_CHECK - Warning!\n",0x18);
    pcVar2 = "  B <= 0.0\n";
    lVar1 = 0xb;
  }
  else {
    if (0 < c) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERLANG_CHECK - Warning!\n",0x18);
    pcVar2 = "  C <= 0.\n";
    lVar1 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,lVar1);
  return false;
}

Assistant:

bool erlang_check ( double /*a*/, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    ERLANG_CHECK checks the parameters of the Erlang PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, int C, the parameters of the PDF.
//    0.0 < B.
//    0 < C.
//
//    Output, bool ERLANG_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "ERLANG_CHECK - Warning!\n";
    cerr << "  B <= 0.0\n";
    return false;
  }

  if ( c <= 0 )
  {
    cerr << " \n";
    cerr << "ERLANG_CHECK - Warning!\n";
    cerr << "  C <= 0.\n";
    return false;
  }

  return true;
}